

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spell_corrector.cpp
# Opt level: O1

TWords * __thiscall
NJamSpell::TSpellCorrector::Edits2
          (TWords *__return_storage_ptr__,TSpellCorrector *this,TWord *word,bool lastLevel)

{
  TWord *__args;
  pointer *ppTVar1;
  pointer pwVar2;
  iterator iVar3;
  wstring *pwVar4;
  unordered_set<wchar_t,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<wchar_t>_>
  *puVar5;
  pointer pTVar6;
  undefined8 uVar7;
  _Hash_node_base *p_Var8;
  size_type *local_f0;
  wstring w;
  TWord local_c8;
  pointer local_b8 [2];
  undefined1 auStack_a8 [8];
  wstring s;
  TWord c;
  undefined1 local_50 [32];
  
  local_f0 = &w._M_string_length;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>
            ((wstring *)&local_f0,word->Ptr,word->Ptr + word->Len);
  (__return_storage_ptr__->super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (w._M_dataplus._M_p != (pointer)0xffffffffffffffff) {
    __args = (TWord *)(&s.field_2._M_allocated_capacity + 1);
    uVar7 = (pointer)0x0;
    do {
      if ((ulong)uVar7 < w._M_dataplus._M_p) {
        std::__cxx11::wstring::substr((ulong)local_50,(ulong)&local_f0);
        std::__cxx11::wstring::substr((ulong)__args,(ulong)&local_f0);
        pTVar6 = (pointer)0x3;
        if ((pointer)local_50._0_8_ != (pointer)(local_50 + 0x10)) {
          pTVar6 = (pointer)local_50._16_8_;
        }
        if (pTVar6 < (pointer)((long)c.Ptr + local_50._8_8_)) {
          pTVar6 = (pointer)0x3;
          if ((size_t *)s.field_2._8_8_ != &c.Len) {
            pTVar6 = (pointer)c.Len;
          }
          if (pTVar6 < (pointer)((long)c.Ptr + local_50._8_8_)) goto LAB_00125c46;
          pwVar4 = (wstring *)
                   std::__cxx11::wstring::replace((ulong)__args,0,(wchar_t *)0x0,local_50._0_8_);
        }
        else {
LAB_00125c46:
          pwVar4 = (wstring *)std::__cxx11::wstring::_M_append((wchar_t *)local_50,s.field_2._8_8_);
        }
        std::__cxx11::wstring::wstring((wstring *)auStack_a8,pwVar4);
        if ((size_t *)s.field_2._8_8_ != &c.Len) {
          operator_delete((void *)s.field_2._8_8_);
        }
        if ((pointer)local_50._0_8_ != (pointer)(local_50 + 0x10)) {
          operator_delete((void *)local_50._0_8_);
        }
        join_0x00000010_0x00000000_ = TLangModel::GetWord(&this->LangModel,(wstring *)auStack_a8);
        if (s._32_8_ != 0 && s.field_2._8_8_ != (wchar_t *)0x0) {
          iVar3._M_current =
               (__return_storage_ptr__->
               super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar3._M_current ==
              (__return_storage_ptr__->
              super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<NJamSpell::TWord,std::allocator<NJamSpell::TWord>>::
            _M_realloc_insert<NJamSpell::TWord_const&>
                      ((vector<NJamSpell::TWord,std::allocator<NJamSpell::TWord>> *)
                       __return_storage_ptr__,iVar3,__args);
          }
          else {
            *iVar3._M_current = join_0x00000010_0x00000000_;
            ppTVar1 = &(__return_storage_ptr__->
                       super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>).
                       _M_impl.super__Vector_impl_data._M_finish;
            *ppTVar1 = *ppTVar1 + 1;
          }
        }
        if (!lastLevel) {
          local_c8.Ptr = (wchar_t *)auStack_a8;
          local_c8.Len = (size_t)s._M_dataplus._M_p;
          Edits2((TWords *)local_50,this,&local_c8,true);
          std::vector<NJamSpell::TWord,std::allocator<NJamSpell::TWord>>::
          _M_range_insert<__gnu_cxx::__normal_iterator<NJamSpell::TWord_const*,std::vector<NJamSpell::TWord,std::allocator<NJamSpell::TWord>>>>
                    ((vector<NJamSpell::TWord,std::allocator<NJamSpell::TWord>> *)
                     __return_storage_ptr__,
                     (__return_storage_ptr__->
                     super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>).
                     _M_impl.super__Vector_impl_data._M_finish,local_50._0_8_,local_50._8_8_);
          if ((pointer)local_50._0_8_ != (pointer)0x0) {
            operator_delete((void *)local_50._0_8_);
          }
        }
        if (auStack_a8 != (undefined1  [8])&s._M_string_length) {
          operator_delete((void *)auStack_a8);
        }
      }
      pwVar2 = (pointer)(uVar7 + 1);
      if (pwVar2 < w._M_dataplus._M_p) {
        std::__cxx11::wstring::substr((ulong)auStack_a8,(ulong)&local_f0);
        std::__cxx11::wstring::substr((ulong)local_50,(ulong)&local_f0);
        std::__cxx11::wstring::_M_append((wchar_t *)auStack_a8,local_50._0_8_);
        if ((pointer)local_50._0_8_ != (pointer)(local_50 + 0x10)) {
          operator_delete((void *)local_50._0_8_);
        }
        std::__cxx11::wstring::substr((ulong)local_50,(ulong)&local_f0);
        std::__cxx11::wstring::_M_append((wchar_t *)auStack_a8,local_50._0_8_);
        if ((pointer)local_50._0_8_ != (pointer)(local_50 + 0x10)) {
          operator_delete((void *)local_50._0_8_);
        }
        if ((pointer)(uVar7 + 2) < w._M_dataplus._M_p) {
          std::__cxx11::wstring::substr((ulong)local_50,(ulong)&local_f0);
          std::__cxx11::wstring::_M_append((wchar_t *)auStack_a8,local_50._0_8_);
          if ((pointer)local_50._0_8_ != (pointer)(local_50 + 0x10)) {
            operator_delete((void *)local_50._0_8_);
          }
        }
        join_0x00000010_0x00000000_ = TLangModel::GetWord(&this->LangModel,(wstring *)auStack_a8);
        if (s._32_8_ != 0 && s.field_2._8_8_ != (wchar_t *)0x0) {
          iVar3._M_current =
               (__return_storage_ptr__->
               super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar3._M_current ==
              (__return_storage_ptr__->
              super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<NJamSpell::TWord,std::allocator<NJamSpell::TWord>>::
            _M_realloc_insert<NJamSpell::TWord_const&>
                      ((vector<NJamSpell::TWord,std::allocator<NJamSpell::TWord>> *)
                       __return_storage_ptr__,iVar3,__args);
          }
          else {
            *iVar3._M_current = join_0x00000010_0x00000000_;
            ppTVar1 = &(__return_storage_ptr__->
                       super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>).
                       _M_impl.super__Vector_impl_data._M_finish;
            *ppTVar1 = *ppTVar1 + 1;
          }
        }
        if (!lastLevel) {
          local_c8.Ptr = (wchar_t *)auStack_a8;
          local_c8.Len = (size_t)s._M_dataplus._M_p;
          Edits2((TWords *)local_50,this,&local_c8,true);
          std::vector<NJamSpell::TWord,std::allocator<NJamSpell::TWord>>::
          _M_range_insert<__gnu_cxx::__normal_iterator<NJamSpell::TWord_const*,std::vector<NJamSpell::TWord,std::allocator<NJamSpell::TWord>>>>
                    ((vector<NJamSpell::TWord,std::allocator<NJamSpell::TWord>> *)
                     __return_storage_ptr__,
                     (__return_storage_ptr__->
                     super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>).
                     _M_impl.super__Vector_impl_data._M_finish,local_50._0_8_,local_50._8_8_);
          if ((pointer)local_50._0_8_ != (pointer)0x0) {
            operator_delete((void *)local_50._0_8_);
          }
        }
        if (auStack_a8 != (undefined1  [8])&s._M_string_length) {
          operator_delete((void *)auStack_a8);
        }
      }
      w.field_2._8_8_ = pwVar2;
      if ((ulong)uVar7 < w._M_dataplus._M_p) {
        puVar5 = TLangModel::GetAlphabet(&this->LangModel);
        for (p_Var8 = (puVar5->_M_h)._M_before_begin._M_nxt; p_Var8 != (_Hash_node_base *)0x0;
            p_Var8 = p_Var8->_M_nxt) {
          std::__cxx11::wstring::substr((ulong)__args,(ulong)&local_f0);
          pwVar4 = (wstring *)
                   std::__cxx11::wstring::_M_replace_aux((ulong)__args,(ulong)c.Ptr,0,L'\x01');
          std::__cxx11::wstring::wstring((wstring *)local_50,pwVar4);
          std::__cxx11::wstring::substr((ulong)&local_c8,(ulong)&local_f0);
          pTVar6 = (pointer)0x3;
          if ((pointer)local_50._0_8_ != (pointer)(local_50 + 0x10)) {
            pTVar6 = (pointer)local_50._16_8_;
          }
          if (pTVar6 < (pointer)(local_c8.Len + local_50._8_8_)) {
            pTVar6 = (pointer)0x3;
            if ((pointer *)local_c8.Ptr != local_b8) {
              pTVar6 = local_b8[0];
            }
            if (pTVar6 < (pointer)(local_c8.Len + local_50._8_8_)) goto LAB_00125fac;
            pwVar4 = (wstring *)
                     std::__cxx11::wstring::replace
                               ((ulong)&local_c8,0,(wchar_t *)0x0,local_50._0_8_);
          }
          else {
LAB_00125fac:
            pwVar4 = (wstring *)
                     std::__cxx11::wstring::_M_append((wchar_t *)local_50,(ulong)local_c8.Ptr);
          }
          std::__cxx11::wstring::wstring((wstring *)auStack_a8,pwVar4);
          if ((pointer *)local_c8.Ptr != local_b8) {
            operator_delete(local_c8.Ptr);
          }
          if ((pointer)local_50._0_8_ != (pointer)(local_50 + 0x10)) {
            operator_delete((void *)local_50._0_8_);
          }
          if ((size_t *)s.field_2._8_8_ != &c.Len) {
            operator_delete((void *)s.field_2._8_8_);
          }
          join_0x00000010_0x00000000_ = TLangModel::GetWord(&this->LangModel,(wstring *)auStack_a8);
          if (s._32_8_ != 0 && s.field_2._8_8_ != (wchar_t *)0x0) {
            iVar3._M_current =
                 (__return_storage_ptr__->
                 super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar3._M_current ==
                (__return_storage_ptr__->
                super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>)._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<NJamSpell::TWord,std::allocator<NJamSpell::TWord>>::
              _M_realloc_insert<NJamSpell::TWord_const&>
                        ((vector<NJamSpell::TWord,std::allocator<NJamSpell::TWord>> *)
                         __return_storage_ptr__,iVar3,__args);
            }
            else {
              *iVar3._M_current = join_0x00000010_0x00000000_;
              ppTVar1 = &(__return_storage_ptr__->
                         super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>).
                         _M_impl.super__Vector_impl_data._M_finish;
              *ppTVar1 = *ppTVar1 + 1;
            }
          }
          if (!lastLevel) {
            local_c8.Ptr = (wchar_t *)auStack_a8;
            local_c8.Len = (size_t)s._M_dataplus._M_p;
            Edits2((TWords *)local_50,this,&local_c8,true);
            std::vector<NJamSpell::TWord,std::allocator<NJamSpell::TWord>>::
            _M_range_insert<__gnu_cxx::__normal_iterator<NJamSpell::TWord_const*,std::vector<NJamSpell::TWord,std::allocator<NJamSpell::TWord>>>>
                      ((vector<NJamSpell::TWord,std::allocator<NJamSpell::TWord>> *)
                       __return_storage_ptr__,
                       (__return_storage_ptr__->
                       super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>).
                       _M_impl.super__Vector_impl_data._M_finish,local_50._0_8_,local_50._8_8_);
            if ((pointer)local_50._0_8_ != (pointer)0x0) {
              operator_delete((void *)local_50._0_8_);
            }
          }
          if (auStack_a8 != (undefined1  [8])&s._M_string_length) {
            operator_delete((void *)auStack_a8);
          }
        }
      }
      puVar5 = TLangModel::GetAlphabet(&this->LangModel);
      for (p_Var8 = (puVar5->_M_h)._M_before_begin._M_nxt; p_Var8 != (_Hash_node_base *)0x0;
          p_Var8 = p_Var8->_M_nxt) {
        std::__cxx11::wstring::substr((ulong)__args,(ulong)&local_f0);
        pwVar4 = (wstring *)
                 std::__cxx11::wstring::_M_replace_aux((ulong)__args,(ulong)c.Ptr,0,L'\x01');
        std::__cxx11::wstring::wstring((wstring *)local_50,pwVar4);
        std::__cxx11::wstring::substr((ulong)&local_c8,(ulong)&local_f0);
        pTVar6 = (pointer)0x3;
        if ((pointer)local_50._0_8_ != (pointer)(local_50 + 0x10)) {
          pTVar6 = (pointer)local_50._16_8_;
        }
        if (pTVar6 < (pointer)(local_c8.Len + local_50._8_8_)) {
          pTVar6 = (pointer)0x3;
          if ((pointer *)local_c8.Ptr != local_b8) {
            pTVar6 = local_b8[0];
          }
          if (pTVar6 < (pointer)(local_c8.Len + local_50._8_8_)) goto LAB_00126188;
          pwVar4 = (wstring *)
                   std::__cxx11::wstring::replace((ulong)&local_c8,0,(wchar_t *)0x0,local_50._0_8_);
        }
        else {
LAB_00126188:
          pwVar4 = (wstring *)
                   std::__cxx11::wstring::_M_append((wchar_t *)local_50,(ulong)local_c8.Ptr);
        }
        std::__cxx11::wstring::wstring((wstring *)auStack_a8,pwVar4);
        if ((pointer *)local_c8.Ptr != local_b8) {
          operator_delete(local_c8.Ptr);
        }
        if ((pointer)local_50._0_8_ != (pointer)(local_50 + 0x10)) {
          operator_delete((void *)local_50._0_8_);
        }
        if ((size_t *)s.field_2._8_8_ != &c.Len) {
          operator_delete((void *)s.field_2._8_8_);
        }
        join_0x00000010_0x00000000_ = TLangModel::GetWord(&this->LangModel,(wstring *)auStack_a8);
        if (s._32_8_ != 0 && s.field_2._8_8_ != (wchar_t *)0x0) {
          iVar3._M_current =
               (__return_storage_ptr__->
               super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar3._M_current ==
              (__return_storage_ptr__->
              super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<NJamSpell::TWord,std::allocator<NJamSpell::TWord>>::
            _M_realloc_insert<NJamSpell::TWord_const&>
                      ((vector<NJamSpell::TWord,std::allocator<NJamSpell::TWord>> *)
                       __return_storage_ptr__,iVar3,__args);
          }
          else {
            *iVar3._M_current = join_0x00000010_0x00000000_;
            ppTVar1 = &(__return_storage_ptr__->
                       super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>).
                       _M_impl.super__Vector_impl_data._M_finish;
            *ppTVar1 = *ppTVar1 + 1;
          }
        }
        if (!lastLevel) {
          local_c8.Ptr = (wchar_t *)auStack_a8;
          local_c8.Len = (size_t)s._M_dataplus._M_p;
          Edits2((TWords *)local_50,this,&local_c8,true);
          std::vector<NJamSpell::TWord,std::allocator<NJamSpell::TWord>>::
          _M_range_insert<__gnu_cxx::__normal_iterator<NJamSpell::TWord_const*,std::vector<NJamSpell::TWord,std::allocator<NJamSpell::TWord>>>>
                    ((vector<NJamSpell::TWord,std::allocator<NJamSpell::TWord>> *)
                     __return_storage_ptr__,
                     (__return_storage_ptr__->
                     super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>).
                     _M_impl.super__Vector_impl_data._M_finish,local_50._0_8_,local_50._8_8_);
          if ((pointer)local_50._0_8_ != (pointer)0x0) {
            operator_delete((void *)local_50._0_8_);
          }
        }
        if (auStack_a8 != (undefined1  [8])&s._M_string_length) {
          operator_delete((void *)auStack_a8);
        }
      }
      uVar7 = w.field_2._8_8_;
    } while ((ulong)w.field_2._8_8_ < (long)w._M_dataplus._M_p + 1U);
  }
  if (local_f0 != &w._M_string_length) {
    operator_delete(local_f0);
  }
  return __return_storage_ptr__;
}

Assistant:

TWords TSpellCorrector::Edits2(const TWord& word, bool lastLevel) const {
    std::wstring w(word.Ptr, word.Len);
    TWords result;

    for (size_t i = 0; i < w.size() + 1; ++i) {
        // delete
        if (i < w.size()) {
            std::wstring s = w.substr(0, i) + w.substr(i+1);
            TWord c = LangModel.GetWord(s);
            if (c.Ptr && c.Len) {
                result.push_back(c);
            }
            if (!lastLevel) {
                AddVec(result, Edits2(TWord(s)));
            }
        }

        // transpose
        if (i + 1 < w.size()) {
            std::wstring s = w.substr(0, i);
            s += w.substr(i + 1, 1);
            s += w.substr(i, 1);
            if (i + 2 < w.size()) {
                s += w.substr(i+2);
            }
            TWord c = LangModel.GetWord(s);
            if (c.Ptr && c.Len) {
                result.push_back(c);
            }
            if (!lastLevel) {
                AddVec(result, Edits2(TWord(s)));
            }
        }

        // replace
        if (i < w.size()) {
            for (auto&& ch: LangModel.GetAlphabet()) {
                std::wstring s = w.substr(0, i) + ch + w.substr(i+1);
                TWord c = LangModel.GetWord(s);
                if (c.Ptr && c.Len) {
                    result.push_back(c);
                }
                if (!lastLevel) {
                    AddVec(result, Edits2(TWord(s)));
                }
            }
        }

        // inserts
        {
            for (auto&& ch: LangModel.GetAlphabet()) {
                std::wstring s = w.substr(0, i) + ch + w.substr(i);
                TWord c = LangModel.GetWord(s);
                if (c.Ptr && c.Len) {
                    result.push_back(c);
                }
                if (!lastLevel) {
                    AddVec(result, Edits2(TWord(s)));
                }
            }
        }
    }

    return result;
}